

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

heapelement_t * yanktop(heapelement_t ***heap,int32 heapsize,int32 *newsize)

{
  int iVar1;
  int32 iVar2;
  heapelement_t *phVar3;
  heapelement_t *l1;
  heapelement_t *l2;
  int32 iVar4;
  heapelement_t **pphVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pphVar5 = *heap;
  phVar3 = *pphVar5;
  *pphVar5 = pphVar5[(long)heapsize + -1];
  if (1 < heapsize) {
    iVar7 = heapsize + -2;
    iVar8 = 0;
    do {
      iVar1 = iVar8 * 2 + 2;
      if (iVar7 <= iVar8 * 2 && iVar7 < iVar1) break;
      iVar6 = iVar8 * 2 + 1;
      if (iVar6 != iVar7) {
        iVar4 = compare(pphVar5[iVar1],pphVar5[iVar6]);
        if (-1 < iVar4) {
          iVar6 = iVar1;
        }
      }
      l1 = pphVar5[iVar8];
      l2 = pphVar5[iVar6];
      iVar4 = compare(l1,l2);
      if (-1 < iVar4) break;
      iVar4 = l1->heapid;
      iVar2 = l2->heapid;
      pphVar5[iVar8] = l2;
      pphVar5[iVar6] = l1;
      pphVar5[iVar8]->heapid = iVar4;
      l1->heapid = iVar2;
      iVar8 = iVar6;
    } while (iVar6 < heapsize + -1);
  }
  *newsize = heapsize + -1;
  pphVar5 = (heapelement_t **)realloc(pphVar5,((long)heapsize + -1) * 8);
  *heap = pphVar5;
  return phVar3;
}

Assistant:

heapelement_t *yanktop(heapelement_t ***heap, int32 heapsize, int32 *newsize)
{
    heapelement_t **lheap,*out;
    int32 left,right,high,id = 0,newheapsize;

    lheap = *heap;
    out = lheap[0];

    lheap[0] = lheap[heapsize-1];
    id = 0;
    while (id < heapsize-1) {
        left = LEFTCHILD(id);
        right = RIGHTCHILD(id);
        if (right > heapsize-2 && left > heapsize-2) break;
        if (left == heapsize-2) high = left;
        else {
            if (compare(lheap[right],lheap[left]) < 0) high = left;
            else high = right; 
        }
        if (compare(lheap[id],lheap[high]) < 0){
            SWAP(lheap[id],lheap[high]);
            id = high;
        }
        else break;
    }

    *newsize = newheapsize = heapsize-1;
    *heap = (heapelement_t**) realloc(lheap,newheapsize*sizeof(heapelement_t*));

    return(out);
}